

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O0

void __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,char>,int,void,char>::
SortedSingleFileIndexedStorage<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,_DOCTEST_ANON_SUITE_2::_DOCTEST_ANON_FUNC_49()::__2,_DOCTEST_ANON_SUITE_2::_DOCTEST_ANON_FUNC_49()::__3>
          (void *param_1,undefined8 param_2,undefined8 param_3,byte param_4,
          __normal_iterator<supermap::KeyValue<char,_char>_*,_std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>_>
          param_5,__normal_iterator<supermap::KeyValue<char,_char>_*,_std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>_>
                  param_6,
          __normal_iterator<supermap::KeyValue<char,_char>_*,_std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>_>
          param_7)

{
  __normal_iterator<supermap::KeyValue<char,_char>_*,_std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>_>
  __last;
  difference_type dVar1;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>_>_>_()>
  *in_stack_fffffffffffffed8;
  path *in_stack_fffffffffffffee0;
  InnerRegisterSupplier *in_stack_ffffffffffffff48;
  shared_ptr<supermap::io::FileManager> *in_stack_ffffffffffffff50;
  path *in_stack_ffffffffffffff58;
  SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void> *in_stack_ffffffffffffff60;
  path local_60;
  KeyValue<char,_char> *local_38;
  KeyValue<char,_char> *local_30;
  byte local_21;
  void *local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  local_21 = param_4 & 1;
  local_38 = param_6._M_current;
  local_30 = param_5._M_current;
  local_20 = param_1;
  local_10 = param_3;
  local_8 = param_2;
  std::filesystem::__cxx11::path::path
            (&local_60,(string_type *)param_1,(format)((ulong)param_7._M_current >> 0x38));
  std::shared_ptr<supermap::io::FileManager>::shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffee0,
             (shared_ptr<supermap::io::FileManager> *)in_stack_fffffffffffffed8);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>_>_>_()>
  ::function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>_>_>_()>
              *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void>::SingleFileIndexedStorage
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_void>_>_>_()>
               *)0x141e13);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x141e20);
  std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffee0);
  Findable<supermap::KeyValue<char,_char>,_char>::Findable
            ((Findable<supermap::KeyValue<char,_char>,_char> *)
             &(((OrderedStorage<supermap::KeyValue<char,_char>,_int,_void> *)((long)param_1 + 0x20))
              ->register_).count_);
  ((OrderedStorage<supermap::KeyValue<char,_char>,_int,_void> *)param_1)->_vptr_OrderedStorage =
       (_func_int **)&PTR_append_0038b240;
  *(undefined **)
   &(((OrderedStorage<supermap::KeyValue<char,_char>,_int,_void> *)((long)param_1 + 0x20))->
    register_).count_ = &DAT_0038b288;
  __last._M_current =
       (KeyValue<char,_char> *)
       OrderedStorage<supermap::KeyValue<char,_char>,_int,_void>::getRegister
                 ((OrderedStorage<supermap::KeyValue<char,_char>,_int,_void> *)param_1);
  dVar1 = std::
          distance<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>>
                    (param_5,__last);
  (**(code **)(*(long *)__last._M_current + 0x28))(__last._M_current,dVar1 + 1);
  if ((local_21 & 1) == 0) {
    sortedEndIterator<_DOCTEST_ANON_SUITE_2::_DOCTEST_ANON_FUNC_49()::__2,_DOCTEST_ANON_SUITE_2::_DOCTEST_ANON_FUNC_49()::__3,__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,void>
              (local_8,local_10);
  }
  SingleFileIndexedStorage<supermap::KeyValue<char,char>,int,void>::
  appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,void>
            ((SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_int,_void> *)
             param_5._M_current,param_7,param_6);
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(Iterator begin,
                                            Iterator end,
                                            bool sorted,
                                            std::string dataFileName,
                                            std::shared_ptr<io::FileManager> manager,
                                            IsLess isLess,
                                            IsEq isEq,
                                            InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(std::move(dataFileName),
                                                          manager,
                                                          std::move(registerSupplier)) {
        getRegister().reserve(std::distance(begin, end) + 1);
        appendAll(begin, sorted ? end : sortedEndIterator(begin, end, isLess, isEq));
    }